

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestForward
               (ImGuiDir move_dir,ImGuiDir clip_dir,ImGuiNavMoveFlags move_flags,
               ImGuiScrollFlags scroll_flags)

{
  ImGuiContext *pIVar1;
  ImGuiScrollFlags in_ECX;
  uint in_EDX;
  ImGuiDir in_ESI;
  ImGuiDir in_EDI;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  NavMoveRequestCancel();
  pIVar1->NavMoveForwardToNextFrame = true;
  pIVar1->NavMoveDir = in_EDI;
  pIVar1->NavMoveClipDir = in_ESI;
  pIVar1->NavMoveFlags = in_EDX | 0x80;
  pIVar1->NavMoveScrollFlags = in_ECX;
  return;
}

Assistant:

void ImGui::NavMoveRequestForward(ImGuiDir move_dir, ImGuiDir clip_dir, ImGuiNavMoveFlags move_flags, ImGuiScrollFlags scroll_flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavMoveForwardToNextFrame == false);
    NavMoveRequestCancel();
    g.NavMoveForwardToNextFrame = true;
    g.NavMoveDir = move_dir;
    g.NavMoveClipDir = clip_dir;
    g.NavMoveFlags = move_flags | ImGuiNavMoveFlags_Forwarded;
    g.NavMoveScrollFlags = scroll_flags;
}